

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MainWindow.cpp
# Opt level: O0

void __thiscall MainWindow::on_actionAbout_triggered(MainWindow *this)

{
  char *pcVar1;
  QString local_f8;
  QString local_e0;
  QString local_c8;
  QString local_b0;
  QString local_98;
  QString local_80;
  QString local_68;
  QString local_40;
  undefined1 local_28 [8];
  QString mt32emuVersion;
  MainWindow *this_local;
  
  mt32emuVersion.d.size = (qsizetype)this;
  pcVar1 = MT32Emu::Synth::getLibraryVersionString();
  QString::QString((QString *)local_28,pcVar1);
  QString::QString(&local_40,"About");
  ::operator+(&local_e0,
              "Munt - Roland (R) MT-32 sound module emulator\n\nMunt mt32emu_qt GUI Application Version 1.11.1\nMunt Library Version "
              ,(QString *)local_28);
  ::operator+(&local_c8,&local_e0,"\nQt Library Version ");
  pcVar1 = (char *)qVersion();
  ::operator+(&local_b0,&local_c8,pcVar1);
  ::operator+(&local_98,&local_b0,"\n\nBuild Arch: Linux ");
  QString::number((int)&local_f8,0x40);
  ::operator+(&local_80,&local_98,&local_f8);
  ::operator+(&local_68,&local_80,
              "-bit\nBuild Date: May  2 2025\n\nCopyright (C) 2011-2022 Jerome Fisher, Sergey V. Mikayev\n\nLicensed under GPL v3 or any later version."
             );
  QMessageBox::about((QWidget *)this,(QString *)&local_40,(QString *)&local_68);
  QString::~QString(&local_68);
  QString::~QString(&local_80);
  QString::~QString(&local_f8);
  QString::~QString(&local_98);
  QString::~QString(&local_b0);
  QString::~QString(&local_c8);
  QString::~QString(&local_e0);
  QString::~QString(&local_40);
  QString::~QString((QString *)local_28);
  return;
}

Assistant:

void MainWindow::on_actionAbout_triggered() {
#ifdef BUILD_MT32EMU_VERSION
	QString mt32emuVersion = BUILD_MT32EMU_VERSION;
#else
	QString mt32emuVersion = MT32Emu::Synth::getLibraryVersionString();
#endif
	QMessageBox::about(this, "About",
		"Munt - Roland (R) MT-32 sound module emulator\n"
		"\n"
		"Munt mt32emu_qt GUI Application Version " MT32EMU_QT_VERSION "\n"
		"Munt Library Version " + mt32emuVersion + "\n"
		"Qt Library Version " + qVersion() + "\n"
		"\n"
		"Build Arch: " BUILD_SYSTEM " " + QString::number(QSysInfo::WordSize) + "-bit\n"
		"Build Date: " BUILD_DATE "\n"
		"\n"
		"Copyright (C) 2011-2022 Jerome Fisher, Sergey V. Mikayev\n"
		"\n"
		"Licensed under GPL v3 or any later version."
	);
}